

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::InitBinds(CConnman *this,Options *options)

{
  long lVar1;
  pointer pCVar2;
  pointer pNVar3;
  bool bVar4;
  bool bVar5;
  uint16_t uVar6;
  CService *addrBind;
  pointer pNVar7;
  pointer pCVar8;
  long in_FS_OFFSET;
  in_addr inaddr_any;
  CService ipv4_any;
  CService ipv6_any;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar8 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar5 = false;
  do {
    if (pCVar8 == pCVar2) {
      pNVar7 = (options->vWhiteBinds).
               super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar3 = (options->vWhiteBinds).
               super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00713cf7;
    }
    bVar4 = Bind(this,pCVar8,1,None);
    pCVar8 = pCVar8 + 1;
  } while (bVar4);
  goto LAB_00713dde;
  while( true ) {
    bVar5 = Bind(this,&pNVar7->m_service,1,(pNVar7->super_NetPermissions).m_flags);
    pNVar7 = pNVar7 + 1;
    if (!bVar5) break;
LAB_00713cf7:
    if (pNVar7 == pNVar3) {
      pCVar8 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar5 = false;
      goto LAB_00713d30;
    }
  }
LAB_00713d15:
  bVar5 = false;
  goto LAB_00713dde;
  while( true ) {
    bVar4 = Bind(this,pCVar8,3,None);
    pCVar8 = pCVar8 + 1;
    if (!bVar4) break;
LAB_00713d30:
    if (pCVar8 == pCVar2) {
      if (options->bind_on_any == true) {
        ipv4_any.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
        ipv4_any.super_CNetAddr.m_addr._union._8_8_ = 0;
        uVar6 = GetListenPort();
        CService::CService(&ipv6_any,(in6_addr *)&ipv4_any,uVar6);
        Bind(this,&ipv6_any,0,None);
        inaddr_any.s_addr = 0;
        uVar6 = GetListenPort();
        CService::CService(&ipv4_any,&inaddr_any,uVar6);
        bVar5 = Bind(this,&ipv4_any,1,None);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&ipv4_any);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&ipv6_any);
        if (!bVar5) goto LAB_00713d15;
      }
      bVar5 = true;
      break;
    }
  }
LAB_00713dde:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CConnman::InitBinds(const Options& options)
{
    for (const auto& addrBind : options.vBinds) {
        if (!Bind(addrBind, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    for (const auto& addrBind : options.vWhiteBinds) {
        if (!Bind(addrBind.m_service, BF_REPORT_ERROR, addrBind.m_flags)) {
            return false;
        }
    }
    for (const auto& addr_bind : options.onion_binds) {
        if (!Bind(addr_bind, BF_REPORT_ERROR | BF_DONT_ADVERTISE, NetPermissionFlags::None)) {
            return false;
        }
    }
    if (options.bind_on_any) {
        // Don't consider errors to bind on IPv6 "::" fatal because the host OS
        // may not have IPv6 support and the user did not explicitly ask us to
        // bind on that.
        const CService ipv6_any{in6_addr(IN6ADDR_ANY_INIT), GetListenPort()}; // ::
        Bind(ipv6_any, BF_NONE, NetPermissionFlags::None);

        struct in_addr inaddr_any;
        inaddr_any.s_addr = htonl(INADDR_ANY);
        const CService ipv4_any{inaddr_any, GetListenPort()}; // 0.0.0.0
        if (!Bind(ipv4_any, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    return true;
}